

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
webots_velocity_message_write_read::test_method(webots_velocity_message_write_read *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_1b0;
  basic_cstring<const_char> local_1a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_190;
  undefined1 local_169 [9];
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  local_160;
  assertion_result local_150;
  basic_cstring<const_char> local_138;
  basic_cstring<const_char> local_128;
  basic_cstring<const_char> local_118;
  basic_cstring<const_char> local_108;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_f8;
  undefined1 local_d1 [9];
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  local_c8;
  assertion_result local_b8;
  basic_cstring<const_char> local_a0;
  basic_cstring<const_char> local_90;
  undefined1 local_80 [8];
  buffer_reader reader;
  webots_velocity_message read_msg;
  undefined1 local_48 [8];
  buffer_writer writer;
  buffer buffer;
  webots_velocity_message write_msg;
  webots_velocity_message_write_read *this_local;
  
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4010666666666666;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&writer._start);
  buffer_writer::buffer_writer((buffer_writer *)local_48,(buffer *)&writer._start);
  ::operator<<((buffer_writer *)local_48,
               (webots_velocity_message *)
               &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  buffer_reader::buffer_reader((buffer_reader *)local_80,(buffer *)&writer._start);
  ::operator>>((buffer_reader *)local_80,(webots_velocity_message *)((long)&reader._index + 4));
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_90,0xa0,&local_a0);
    boost::test_tools::assertion::seed::operator->*((seed *)(local_d1 + 1),(double *)local_d1);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<double&>,double>::operator==
              ((expression_base<boost::test_tools::assertion::value_expr<double&>,double> *)
               &local_c8,(double *)(local_d1 + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
    ::evaluate(&local_b8,&local_c8,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,"read_msg.right_speed == write_msg.right_speed",0x2d);
    boost::unit_test::operator<<(&local_f8,plVar3,&local_108);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_118,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion
              (&local_b8,&local_f8.super_lazy_ostream,&local_118,0xa0,CHECK,CHECK_BUILT_ASSERTION,0)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_f8);
    boost::test_tools::assertion_result::~assertion_result(&local_b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_138);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_128,0xa1,&local_138);
    boost::test_tools::assertion::seed::operator->*((seed *)(local_169 + 1),(double *)local_169);
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<double&>,double>::operator==
              ((expression_base<boost::test_tools::assertion::value_expr<double&>,double> *)
               &local_160,(double *)(local_169 + 1));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
    ::evaluate(&local_150,&local_160,false);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a0,"read_msg.left_speed == write_msg.left_speed",0x2b);
    boost::unit_test::operator<<(&local_190,plVar3,&local_1a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion
              (&local_150,&local_190.super_lazy_ostream,&local_1b0,0xa1,CHECK,CHECK_BUILT_ASSERTION,
               0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_190);
    boost::test_tools::assertion_result::~assertion_result(&local_150);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&writer._start);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(webots_velocity_message_write_read)
{
    webots_velocity_message write_msg;
    write_msg.right_speed = 2.5;
    write_msg.left_speed = 4.1;

    buffer buffer;
    buffer_writer writer(buffer);
    writer << write_msg;

    webots_velocity_message read_msg;
    buffer_reader reader(buffer);
    reader >> read_msg;

    BOOST_TEST(read_msg.right_speed == write_msg.right_speed);
    BOOST_TEST(read_msg.left_speed == write_msg.left_speed);
}